

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefIteratorSparse.h
# Opt level: O0

bool __thiscall BeliefIteratorSparse::Next(BeliefIteratorSparse *this)

{
  bool bVar1;
  const_iterator *this_00;
  long in_RDI;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff98;
  derived_iterator_type *in_stack_ffffffffffffffb8;
  const_iterator *it;
  const_iterator local_30 [2];
  bool local_1;
  
  this_00 = (const_iterator *)(in_RDI + 8);
  boost::numeric::ublas::operator++(in_stack_ffffffffffffffb8,(int)((ulong)this_00 >> 0x20));
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x9c3cb7);
  it = local_30;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::end(in_stack_ffffffffffffff98);
  bVar1 = boost::numeric::ublas::
          compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator::operator==(this_00,it);
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::const_iterator::~const_iterator((const_iterator *)0x9c3cf2);
  local_1 = !bVar1;
  return local_1;
}

Assistant:

bool Next()
        {
            _m_it++;
            if(_m_it==_m_belief->_m_b.end())
                return(false);
            else
                return(true);
        }